

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteConObjExpressions
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this)

{
  File *f;
  char **ppcVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ExprArgWriter ew;
  
  f = &this->nm;
  for (uVar6 = 0;
      uVar3 = (ulong)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons,
      (long)uVar6 < (long)uVar3; uVar6 = uVar6 + 1) {
    ppcVar1 = (this->feeder_->nlme_).row_names_;
    pcVar4 = "";
    if (ppcVar1 != (char **)0x0) {
      pcVar2 = ppcVar1[uVar6];
      pcVar4 = "";
      if (pcVar2 != (char *)0x0) {
        pcVar4 = pcVar2;
      }
    }
    TextFormatter::apr(&this->super_FormatterType,f,"%c%d\t#%s\n",0x43,uVar6 & 0xffffffff,pcVar4);
    ew.nargs_ = 1;
    ew.nlw_ = this;
    ExprArgWriter::NPut(&ew,0.0);
  }
  for (; (long)uVar6 <
         (long)(int)uVar3 +
         (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons;
      uVar6 = uVar6 + 1) {
    ppcVar1 = (this->feeder_->nlme_).row_names_;
    pcVar4 = "";
    if (ppcVar1 != (char **)0x0) {
      pcVar2 = ppcVar1[uVar6];
      pcVar4 = "";
      if (pcVar2 != (char *)0x0) {
        pcVar4 = pcVar2;
      }
    }
    TextFormatter::apr(&this->super_FormatterType,f,"%c%d\t#%s\n",0x4c,(uint)-(int)uVar3 + uVar6,
                       pcVar4);
    ew.nargs_ = 1;
    ew.nlw_ = this;
    ExprArgWriter::NPut(&ew,0.0);
    uVar3 = (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                         num_algebraic_cons;
  }
  for (uVar5 = 0; (int)uVar5 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs;
      uVar5 = uVar5 + 1) {
    TextFormatter::apr(&this->super_FormatterType,f,"%c%d %d\t#%s\n",0x4f,(ulong)uVar5,
                       (ulong)(uint)(this->feeder_->nlme_).obj_sense_,
                       (this->feeder_->nlme_).obj_name_);
    ew.nargs_ = 1;
    ew.nlw_ = this;
    NLFeeder_Easy::
    FeedObjExpression<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::ExprArgWriter>
              (this->feeder_,uVar5,&ew);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConObjExpressions() {
  int i=0;
  for (; i<Hdr().num_algebraic_cons; ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'C', i,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (;
       i<Hdr().num_algebraic_cons + Hdr().num_logical_cons;
       ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'L',
        i - Hdr().num_algebraic_cons,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (i=0; i<Hdr().num_objs; ++i) {
    WriteDefinedVariables(-i-1);              // -i-1
    apr(nm, "%c%d %d\t#%s\n", 'O', i,
        (int)Feeder().ObjType(i),
        Feeder().ObjDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedObjExpression(i, ew);
  }
}